

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O0

void __thiscall ADL_JavaOPL3::OPL3::Update(OPL3 *this,float *output,int numsamples)

{
  Channel *pCVar1;
  double extraout_XMM0_Qa;
  double channelOutput;
  Channel *channel;
  int local_20;
  int channelNumber;
  int array;
  int numsamples_local;
  float *output_local;
  OPL3 *this_local;
  
  channelNumber = numsamples;
  _array = output;
  while (channelNumber != 0) {
    for (local_20 = 0; local_20 < this->_new + 1; local_20 = local_20 + 1) {
      for (channel._4_4_ = 0; channel._4_4_ < 9; channel._4_4_ = channel._4_4_ + 1) {
        pCVar1 = this->channels[local_20][channel._4_4_];
        if (pCVar1 != &(this->disabledChannel).super_Channel) {
          (*pCVar1->_vptr_Channel[2])(pCVar1,this);
          *_array = (float)(extraout_XMM0_Qa * pCVar1->leftPan) + *_array;
          _array[1] = (float)(extraout_XMM0_Qa * pCVar1->rightPan) + _array[1];
        }
      }
    }
    this->vibratoIndex = this->vibratoIndex + 1U & 0x1fff;
    this->tremoloIndex = this->tremoloIndex + 1;
    if (0x347b < this->tremoloIndex) {
      this->tremoloIndex = 0;
    }
    _array = _array + 2;
    channelNumber = channelNumber + -1;
  }
  return;
}

Assistant:

void OPL3::Update(float *output, int numsamples) {
	while (numsamples--) {
		// If _new = 0, use OPL2 mode with 9 channels. If _new = 1, use OPL3 18 channels;
		for(int array=0; array < (_new + 1); array++)
			for(int channelNumber=0; channelNumber < 9; channelNumber++) {
				// Reads output from each OPL3 channel, and accumulates it in the output buffer:
				Channel *channel = channels[array][channelNumber];
				if (channel != &disabledChannel)
				{
					double channelOutput = channel->getChannelOutput(this);
					output[0] += float(channelOutput * channel->leftPan);
					output[1] += float(channelOutput * channel->rightPan);
				}
			}

		// Advances the OPL3-wide vibrato index, which is used by 
		// PhaseGenerator.getPhase() in each Operator.
		vibratoIndex = (vibratoIndex + 1) & (OPL3DataStruct::vibratoTableLength - 1);
		// Advances the OPL3-wide tremolo index, which is used by 
		// EnvelopeGenerator.getEnvelope() in each Operator.
		tremoloIndex++;
		if(tremoloIndex >= OPL3DataStruct::tremoloTableLength) tremoloIndex = 0;
		output += 2;
	}
}